

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O2

bool __thiscall Memory::HeapBlockMap32::OOMRescan(HeapBlockMap32 *this,Recycler *recycler)

{
  HeapInfoManager *this_00;
  HeapBlockType blockType;
  L2MapChunk *pLVar1;
  HeapBlock *this_01;
  PageAllocatorBaseCommon *pPVar2;
  size_t sVar3;
  L2MapChunk *chunk;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *heapBlock;
  code *pcVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  undefined4 *puVar8;
  Segment *pSVar9;
  undefined4 extraout_var;
  IdleDecommitPageAllocator *pIVar10;
  ulong uVar11;
  char *pcVar12;
  Segment *pSVar13;
  char *pcVar14;
  uint lineNumber;
  ulong uVar15;
  long lVar16;
  char *pcVar17;
  char *pcVar18;
  IdleDecommitPageAllocator *pageAllocator;
  long lVar19;
  
  this->anyHeapBlockRescannedDuringOOM = false;
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  this_00 = &recycler->autoHeap;
  bVar5 = 1;
  lVar16 = 0;
  pSVar13 = (Segment *)0x0;
  do {
    if (lVar16 == 0x1000) {
      return (bool)(bVar5 | this->anyHeapBlockRescannedDuringOOM & 1U);
    }
    pLVar1 = this->map[lVar16];
    if (pLVar1 != (L2MapChunk *)0x0) {
      for (lVar19 = 0; lVar19 != 0x100; lVar19 = lVar19 + 1) {
        this_01 = pLVar1->map[lVar19];
        if (this_01 != (HeapBlock *)0x0) {
          pSVar9 = this_01->segment;
          if (pSVar9 == (Segment *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                               ,0x240,"(block->GetSegment() != nullptr)",
                               "block->GetSegment() != nullptr");
            if (!bVar6) goto LAB_0062d90c;
            *puVar8 = 0;
            pSVar9 = this_01->segment;
          }
          if (pSVar9 == pSVar13) {
            if (pSVar13 == (Segment *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar8 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x243,"(currentSegment != nullptr)","currentSegment != nullptr");
              if (!bVar6) goto LAB_0062d90c;
              *puVar8 = 0;
            }
            if ((this_01->address < pSVar13->address) ||
               (pSVar13->address +
                (pSVar13->segmentPageCount - (ulong)pSVar13->secondaryAllocPageCount) * 0x1000 <=
                this_01->address)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar8 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x244,"(currentSegment->IsInSegment(block->GetAddress()))",
                                 "currentSegment->IsInSegment(block->GetAddress())");
joined_r0x0062d42d:
              if (!bVar6) {
LAB_0062d90c:
                pcVar4 = (code *)invalidInstructionException();
                (*pcVar4)();
              }
              *puVar8 = 0;
            }
          }
          else {
            if (pSVar13 != (Segment *)0x0) {
              if ((pSVar13->address <= this_01->address) &&
                 (this_01->address <
                  pSVar13->address +
                  (pSVar13->segmentPageCount - (ulong)pSVar13->secondaryAllocPageCount) * 0x1000)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar8 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                   ,0x249,
                                   "(currentSegment == nullptr || !currentSegment->IsInSegment(block->GetAddress()))"
                                   ,
                                   "currentSegment == nullptr || !currentSegment->IsInSegment(block->GetAddress())"
                                  );
                if (!bVar6) goto LAB_0062d90c;
                *puVar8 = 0;
                pSVar9 = this_01->segment;
              }
            }
            pSVar13 = pSVar9;
            if (pSVar13 == (Segment *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar8 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x24b,"(currentSegment != nullptr)","currentSegment != nullptr");
              if (!bVar6) goto LAB_0062d90c;
              *puVar8 = 0;
            }
            pPVar2 = (pSVar13->super_SegmentBaseCommon).allocator;
            pcVar12 = pSVar13->address;
            sVar3 = pSVar13->segmentPageCount;
            pageAllocator = (IdleDecommitPageAllocator *)&pPVar2[-1].allocatorType;
            if (pPVar2 == (PageAllocatorBaseCommon *)0x0) {
              pageAllocator = (IdleDecommitPageAllocator *)0x0;
            }
            iVar7 = (*this_01->_vptr_HeapBlock[5])(this_01);
            pIVar10 = HeapBlock::GetPageAllocator(this_01,(HeapInfo *)CONCAT44(extraout_var,iVar7));
            if (pageAllocator != pIVar10) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar8 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x251,
                                 "(segmentPageAllocator == block->GetPageAllocator(block->GetHeapInfo()))"
                                 ,
                                 "segmentPageAllocator == block->GetPageAllocator(block->GetHeapInfo())"
                                );
              if (!bVar6) goto LAB_0062d90c;
              *puVar8 = 0;
            }
            pcVar17 = (char *)(sVar3 * 0x1000);
            pcVar18 = this->startAddress;
            if (pcVar12 < pcVar18) {
              if (pcVar17 <= pcVar18 + -(long)pcVar12) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar8 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                   ,600,
                                   "(segmentLength > (size_t)(this->startAddress - segmentStart))",
                                   "segmentLength > (size_t)(this->startAddress - segmentStart)");
                if (!bVar6) goto LAB_0062d90c;
                *puVar8 = 0;
                pcVar18 = this->startAddress;
              }
              pcVar17 = pcVar12 + ((long)pcVar17 - (long)pcVar18);
              pcVar12 = pcVar18;
            }
            pcVar14 = (char *)(0x100000000 - ((long)pcVar12 - (long)pcVar18));
            if (pcVar17 + ((long)pcVar12 - (long)pcVar18) < (char *)0x100000001) {
              pcVar14 = pcVar17;
            }
            if (((ulong)pcVar14 & 0xfff) != 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar8 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x3e1,"(segmentLength % AutoSystemInfo::PageSize == 0)",
                                 "segmentLength % AutoSystemInfo::PageSize == 0");
              if (!bVar6) goto LAB_0062d90c;
              *puVar8 = 0;
            }
            bVar6 = HeapInfoManager::IsRecyclerPageAllocator
                              (this_00,&pageAllocator->super_PageAllocator);
            if ((bVar6) ||
               (bVar6 = HeapInfoManager::IsRecyclerWithBarrierPageAllocator
                                  (this_00,&pageAllocator->super_PageAllocator), bVar6)) {
              bVar6 = Recycler::NeedOOMRescan(recycler);
              if (!bVar6) {
                uVar15 = (ulong)pcVar14 >> 0xc;
                pcVar18 = (char *)0x0;
                while (bVar6 = uVar15 != 0, uVar15 = uVar15 - 1, bVar6) {
                  if (pcVar14 <= pcVar18) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar8 = 1;
                    bVar6 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                       ,0x3f6,
                                       "((size_t)(pageAddress - segmentStart) < segmentLength)",
                                       "(size_t)(pageAddress - segmentStart) < segmentLength");
                    if (!bVar6) goto LAB_0062d90c;
                    *puVar8 = 0;
                  }
                  pcVar17 = pcVar12 + (long)pcVar18;
                  if (this->startAddress != (char *)((ulong)pcVar17 & 0xffffffff00000000)) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar8 = 1;
                    bVar6 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                       ,0x3f9,
                                       "(HeapBlockMap64::GetNodeStartAddress(pageAddress) == this->startAddress)"
                                       ,
                                       "HeapBlockMap64::GetNodeStartAddress(pageAddress) == this->startAddress"
                                      );
                    if (!bVar6) goto LAB_0062d90c;
                    *puVar8 = 0;
                  }
                  chunk = this->map[(ulong)pcVar17 >> 0x14 & 0xfff];
                  if (chunk == (L2MapChunk *)0x0) goto LAB_0062d84b;
                  uVar11 = (ulong)pcVar17 >> 0xc & 0xff;
                  heapBlock = (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)
                              chunk->map[uVar11];
                  if (((heapBlock ==
                        (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) ||
                      (pcVar17 !=
                       (heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
                       super_SmallHeapBlockT<MediumAllocationBlockAttributes>.super_HeapBlock.
                       address)) ||
                     ((heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
                      super_SmallHeapBlockT<MediumAllocationBlockAttributes>.super_HeapBlock.
                      needOOMRescan != true)) goto LAB_0062d84b;
                  (heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
                  super_SmallHeapBlockT<MediumAllocationBlockAttributes>.super_HeapBlock.
                  needOOMRescan = false;
                  blockType = chunk->blockInfo[uVar11].blockType;
                  switch(blockType) {
                  case FreeBlockType:
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar8 = 1;
                    lineNumber = 0x40f;
                    goto LAB_0062d825;
                  case LargeBlockTypeCount:
                  case SmallNormalBlockWithBarrierType:
                    bVar6 = RescanHeapBlockOnOOM<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
                                      (this,(SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *
                                            )heapBlock,pcVar17,blockType,
                                       (uint)chunk->blockInfo[uVar11].bucketIndex,chunk,recycler);
                    break;
                  default:
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar8 = 1;
                    lineNumber = 0x44c;
LAB_0062d825:
                    bVar6 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                       ,lineNumber,"(false)","false");
                    if (bVar6) {
                      *puVar8 = 0;
                      bVar5 = 0;
                      goto LAB_0062d84b;
                    }
                    goto LAB_0062d90c;
                  case SmallFinalizableBlockType:
                  case MediumAllocBlockTypeCount:
                    bVar6 = RescanHeapBlockOnOOM<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
                                      (this,(SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>
                                             *)heapBlock,pcVar17,blockType,
                                       (uint)chunk->blockInfo[uVar11].bucketIndex,chunk,recycler);
                    break;
                  case MediumNormalBlockType:
                  case MediumNormalBlockWithBarrierType:
                    bVar6 = RescanHeapBlockOnOOM<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
                                      (this,(SmallNormalHeapBlockT<MediumAllocationBlockAttributes>
                                             *)heapBlock,pcVar17,blockType,
                                       (uint)chunk->blockInfo[uVar11].bucketIndex,chunk,recycler);
                    break;
                  case MediumFinalizableBlockType:
                  case MediumFinalizableBlockWithBarrierType:
                    bVar6 = RescanHeapBlockOnOOM<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
                                      (this,heapBlock,pcVar17,blockType,
                                       (uint)chunk->blockInfo[uVar11].bucketIndex,chunk,recycler);
                  }
                  bVar5 = 0;
                  if (bVar6 == false) break;
LAB_0062d84b:
                  pcVar18 = pcVar18 + 0x1000;
                }
              }
            }
            else {
              bVar6 = HeapInfoManager::IsRecyclerLeafPageAllocator
                                (this_00,&pageAllocator->super_PageAllocator);
              if ((!bVar6) &&
                 (bVar6 = HeapInfoManager::IsRecyclerLargeBlockPageAllocator
                                    (this_00,&pageAllocator->super_PageAllocator), !bVar6)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar8 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                   ,0x457,
                                   "(recycler->autoHeap.IsRecyclerLeafPageAllocator(segmentPageAllocator) || recycler->autoHeap.IsRecyclerLargeBlockPageAllocator(segmentPageAllocator))"
                                   ,
                                   "recycler->autoHeap.IsRecyclerLeafPageAllocator(segmentPageAllocator) || recycler->autoHeap.IsRecyclerLargeBlockPageAllocator(segmentPageAllocator)"
                                  );
                goto joined_r0x0062d42d;
              }
            }
          }
        }
      }
    }
    lVar16 = lVar16 + 1;
  } while( true );
}

Assistant:

bool
HeapBlockMap32::OOMRescan(Recycler * recycler)
{
    this->anyHeapBlockRescannedDuringOOM = false;
    bool noHeapBlockNeedsRescan = true;

    // Loop through segments and find pages that need OOM Rescan.

    this->ForEachSegment(recycler, [=, &noHeapBlockNeedsRescan] (char * segmentStart, size_t segmentLength, Segment * currentSegment, PageAllocator * segmentPageAllocator) {
        Assert(segmentLength % AutoSystemInfo::PageSize == 0);

        // Process Small non-leaf segments (including write barrier blocks).
        // Large blocks have their own separate write watch handling.
        if (recycler->autoHeap.IsRecyclerPageAllocator(segmentPageAllocator)
#ifdef RECYCLER_WRITE_BARRIER
            || recycler->autoHeap.IsRecyclerWithBarrierPageAllocator(segmentPageAllocator)
#endif
            )
        {
            if (recycler->NeedOOMRescan())
            {
                // We hit OOM again.  Don't try to process any more blocks, leave them for the next OOM pass.
                return;
            }

            // Loop through pages for this segment and check OOM flag.
            size_t pageCount = segmentLength / AutoSystemInfo::PageSize;
            for (size_t i = 0; i < pageCount; i++)
            {
                char * pageAddress = segmentStart + (i * AutoSystemInfo::PageSize);
                Assert((size_t)(pageAddress - segmentStart) < segmentLength);

#if defined(TARGET_64)
                Assert(HeapBlockMap64::GetNodeStartAddress(pageAddress) == this->startAddress);
#endif

                uint id1 = GetLevel1Id(pageAddress);
                L2MapChunk * chunk = map[id1];
                if (chunk != nullptr)
                {
                    uint id2 = GetLevel2Id(pageAddress);
                    HeapBlock * heapBlock = chunk->map[id2];
                    if (heapBlock != nullptr && heapBlock->GetAddress() == pageAddress)
                    {
                        if (heapBlock->GetAndClearNeedOOMRescan())
                        {
                            noHeapBlockNeedsRescan = false;

                            HeapBlock::HeapBlockType blockType = chunk->blockInfo[id2].blockType;

                            // Determine block type and process as appropriate
                            switch (blockType)
                            {
                            case HeapBlock::HeapBlockType::FreeBlockType:
                                // Can't have a free block that has OOMRescan flag set
                                Assert(false);
                                break;

                            case HeapBlock::HeapBlockType::SmallNormalBlockType:
#ifdef RECYCLER_WRITE_BARRIER
                            case HeapBlock::HeapBlockType::SmallNormalBlockWithBarrierType:
#endif
                                if (!RescanHeapBlockOnOOM<SmallNormalHeapBlock>((SmallNormalHeapBlock*)heapBlock, pageAddress, blockType, chunk->blockInfo[id2].bucketIndex, chunk, recycler))
                                {
                                    return;
                                }
                                break;

                            case HeapBlock::HeapBlockType::SmallFinalizableBlockType:
#ifdef RECYCLER_WRITE_BARRIER
                            case HeapBlock::HeapBlockType::SmallFinalizableBlockWithBarrierType:
#endif
                                if (!RescanHeapBlockOnOOM<SmallFinalizableHeapBlock>((SmallFinalizableHeapBlock*) heapBlock, pageAddress, blockType, chunk->blockInfo[id2].bucketIndex, chunk, recycler))
                                {
                                    return;
                                }
                                break;
#ifdef RECYCLER_VISITED_HOST
                            case HeapBlock::HeapBlockType::SmallRecyclerVisitedHostBlockType:
                                if (!RescanHeapBlockOnOOM<SmallRecyclerVisitedHostHeapBlock>((SmallRecyclerVisitedHostHeapBlock*) heapBlock, pageAddress, blockType, chunk->blockInfo[id2].bucketIndex, chunk, recycler))
                                {
                                    return;
                                }
                                break;
#endif

                            case HeapBlock::HeapBlockType::MediumNormalBlockType:
#ifdef RECYCLER_WRITE_BARRIER
                            case HeapBlock::HeapBlockType::MediumNormalBlockWithBarrierType:
#endif
                                if (!RescanHeapBlockOnOOM<MediumNormalHeapBlock>((MediumNormalHeapBlock*)heapBlock, pageAddress, blockType, chunk->blockInfo[id2].bucketIndex, chunk, recycler))
                                {
                                    return;
                                }
                                break;

                            case HeapBlock::HeapBlockType::MediumFinalizableBlockType:
#ifdef RECYCLER_WRITE_BARRIER
                            case HeapBlock::HeapBlockType::MediumFinalizableBlockWithBarrierType:
#endif
                                if (!RescanHeapBlockOnOOM<MediumFinalizableHeapBlock>((MediumFinalizableHeapBlock*) heapBlock, pageAddress, blockType, chunk->blockInfo[id2].bucketIndex, chunk, recycler))
                                {
                                    return;
                                }
                                break;
#ifdef RECYCLER_VISITED_HOST
                            case HeapBlock::HeapBlockType::MediumRecyclerVisitedHostBlockType:
                                if (!RescanHeapBlockOnOOM<MediumRecyclerVisitedHostHeapBlock>((MediumRecyclerVisitedHostHeapBlock*) heapBlock, pageAddress, blockType, chunk->blockInfo[id2].bucketIndex, chunk, recycler))
                                {
                                    return;
                                }
                                break;
#endif

                            default:
                                // Shouldn't be here -- leaf blocks aren't rescanned, and large blocks are handled separately
                                Assert(false);
                                break;
                            }
                        }
                    }
                }
            }
        }
        else
        {
            Assert(recycler->autoHeap.IsRecyclerLeafPageAllocator(segmentPageAllocator) ||
                recycler->autoHeap.IsRecyclerLargeBlockPageAllocator(segmentPageAllocator));
        }
    });

    // TODO: Enable this assert post-Win10
    // Assert(this->anyHeapBlockRescannedDuringOOM);
    // Success if:
    //  No heap block needs OOM rescan OR
    //  A single heap block was rescanned
    return noHeapBlockNeedsRescan || this->anyHeapBlockRescannedDuringOOM;
}